

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void tlstran_pipe_send_cb(void *arg)

{
  nng_err result;
  nni_aio *aio_00;
  nni_aio *aio_01;
  size_t sVar1;
  nni_msg *m;
  nni_aio *txaio;
  nni_msg *msg;
  size_t n;
  nni_aio *aio;
  int rv;
  tlstran_pipe *p;
  void *arg_local;
  
  aio_00 = (nni_aio *)((long)arg + 0xa0);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x600));
  aio_01 = (nni_aio *)nni_list_first((nni_list *)((long)arg + 0x38));
  result = nni_aio_result(aio_00);
  if (result == NNG_OK) {
    sVar1 = nni_aio_count(aio_00);
    nni_aio_iov_advance(aio_00,sVar1);
    sVar1 = nni_aio_iov_count(aio_00);
    if (sVar1 == 0) {
      nni_aio_list_remove(aio_01);
      tlstran_pipe_send_start((tlstran_pipe *)arg);
      m = nni_aio_get_msg(aio_01);
      sVar1 = nni_msg_len(m);
      nni_pipe_bump_tx(*(nni_pipe **)((long)arg + 8),sVar1);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
      nni_aio_set_msg(aio_01,(nni_msg *)0x0);
      nni_msg_free(m);
      nni_aio_finish_sync(aio_01,NNG_OK,sVar1);
    }
    else {
      nng_stream_send(*arg,aio_00);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
    }
  }
  else {
    nni_aio_list_remove(aio_01);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x600));
    nni_aio_finish_error(aio_01,result);
    nni_pipe_bump_error(*(nni_pipe **)((long)arg + 8),result);
  }
  return;
}

Assistant:

static void
tlstran_pipe_send_cb(void *arg)
{
	tlstran_pipe *p = arg;
	int           rv;
	nni_aio      *aio;
	size_t        n;
	nni_msg      *msg;
	nni_aio      *txaio = &p->txaio;

	nni_mtx_lock(&p->mtx);
	aio = nni_list_first(&p->sendq);

	if ((rv = nni_aio_result(txaio)) != 0) {
		// Intentionally we do not queue up another transfer.
		// There's an excellent chance that the pipe is no longer
		// usable, with a partial transfer.
		// The protocol should see this error, and close the
		// pipe itself, we hope.
		nni_aio_list_remove(aio);
		nni_mtx_unlock(&p->mtx);
		nni_aio_finish_error(aio, rv);
		nni_pipe_bump_error(p->npipe, rv);
		return;
	}

	n = nni_aio_count(txaio);
	nni_aio_iov_advance(txaio, n);
	if (nni_aio_iov_count(txaio) > 0) {
		nng_stream_send(p->tls, txaio);
		nni_mtx_unlock(&p->mtx);
		return;
	}
	nni_aio_list_remove(aio);
	tlstran_pipe_send_start(p);

	msg = nni_aio_get_msg(aio);
	n   = nni_msg_len(msg);
	nni_pipe_bump_tx(p->npipe, n);
	nni_mtx_unlock(&p->mtx);
	nni_aio_set_msg(aio, NULL);
	nni_msg_free(msg);
	nni_aio_finish_sync(aio, 0, n);
}